

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

int got_eagain(void)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  return (int)(*piVar1 == 0x73 || *piVar1 == 0xb);
}

Assistant:

static int got_eagain(void) {
#ifdef _WIN32
  return WSAGetLastError() == WSAEWOULDBLOCK;
#else
  return errno == EAGAIN
      || errno == EINPROGRESS
#ifdef EWOULDBLOCK
      || errno == EWOULDBLOCK;
#endif
      ;
#endif
}